

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pEVar1;
  FuncDef *pFVar2;
  byte bVar3;
  int p2;
  int iVar4;
  uint uVar5;
  int iVar6;
  Op *pOVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int p2_00;
  AggInfo_func *pAVar11;
  
  if (0 < pAggInfo->nFunc) {
    p = pParse->pVdbe;
    pAVar11 = pAggInfo->aFunc;
    iVar9 = 0;
    do {
      if (pParse->nErr != 0) {
        return;
      }
      pEVar1 = (pAVar11->pFExpr->x).pList;
      if (-1 < pAVar11->iOBTab) {
        iVar6 = pEVar1->nExpr;
        p2 = sqlite3GetTempRange(pParse,iVar6);
        if (pAVar11->bOBPayload == '\0') {
          iVar10 = 0;
        }
        else {
          iVar10 = ((pAVar11->pFExpr->pLeft->x).pList)->nExpr + (uint)(pAVar11->bOBUnique == '\0');
        }
        iVar4 = sqlite3VdbeAddOp3(p,0x24,pAVar11->iOBTab,0,0);
        if (0 < iVar6) {
          iVar8 = iVar6;
          do {
            sqlite3VdbeAddOp3(p,0x5e,pAVar11->iOBTab,iVar10 + -1 + iVar8,p2 + -1 + iVar8);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        if (pAVar11->bUseSubtype != '\0') {
          if (pParse->nTempReg == '\0') {
            iVar8 = pParse->nMem + 1;
            pParse->nMem = iVar8;
          }
          else {
            bVar3 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar3;
            iVar8 = pParse->aTempReg[bVar3];
          }
          uVar5 = 0;
          if (pAVar11->bOBPayload == '\0') {
            uVar5 = (uint)(pAVar11->bOBUnique == '\0');
          }
          if (0 < iVar6) {
            p2_00 = uVar5 + iVar10 + iVar6 * 2;
            iVar10 = iVar6;
            do {
              p2_00 = p2_00 + -1;
              sqlite3VdbeAddOp3(p,0x5e,pAVar11->iOBTab,p2_00,iVar8);
              sqlite3VdbeAddOp3(p,0xb6,iVar8,iVar10 + p2 + -1,0);
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          if (iVar8 != 0) {
            bVar3 = pParse->nTempReg;
            if ((ulong)bVar3 < 8) {
              pParse->nTempReg = bVar3 + 1;
              pParse->aTempReg[bVar3] = iVar8;
            }
          }
        }
        sqlite3VdbeAddOp3(p,0xa2,0,p2,pAggInfo->iFirstReg + iVar9 + pAggInfo->nColumn);
        pFVar2 = pAVar11->pFunc;
        if (p->db->mallocFailed == '\0') {
          pOVar7 = p->aOp;
          iVar10 = p->nOp;
          pOVar7[(long)iVar10 + -1].p4type = -7;
          pOVar7[(long)iVar10 + -1].p4.pKeyInfo = (KeyInfo *)pFVar2;
        }
        else if ((pFVar2->funcFlags & 0x10) != 0) {
          sqlite3DbNNFreeNN(p->db,pFVar2);
        }
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = (u16)iVar6;
        }
        sqlite3VdbeAddOp3(p,0x27,pAVar11->iOBTab,iVar4 + 1,0);
        pOVar7 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p->db->mallocFailed == '\0') {
          pOVar7 = p->aOp + iVar4;
        }
        pOVar7->p2 = p->nOp;
        if (iVar6 == 1) {
          if (p2 != 0) {
            bVar3 = pParse->nTempReg;
            if ((ulong)bVar3 < 8) {
              pParse->nTempReg = bVar3 + 1;
              pParse->aTempReg[bVar3] = p2;
            }
          }
        }
        else if (pParse->nRangeReg < iVar6) {
          pParse->nRangeReg = iVar6;
          pParse->iRangeReg = p2;
        }
      }
      if (pEVar1 == (ExprList *)0x0) {
        iVar6 = 0;
      }
      else {
        iVar6 = pEVar1->nExpr;
      }
      sqlite3VdbeAddOp3(p,0xa5,pAggInfo->iFirstReg + iVar9 + pAggInfo->nColumn,iVar6,0);
      pFVar2 = pAVar11->pFunc;
      if (p->db->mallocFailed == '\0') {
        pOVar7 = p->aOp;
        iVar6 = p->nOp;
        pOVar7[(long)iVar6 + -1].p4type = -7;
        pOVar7[(long)iVar6 + -1].p4.pKeyInfo = (KeyInfo *)pFVar2;
      }
      else if ((pFVar2->funcFlags & 0x10) != 0) {
        sqlite3DbNNFreeNN(p->db,pFVar2);
      }
      iVar9 = iVar9 + 1;
      pAVar11 = pAVar11 + 1;
    } while (iVar9 < pAggInfo->nFunc);
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    if( pParse->nErr ) return;
    pList = pF->pFExpr->x.pList;
    if( pF->iOBTab>=0 ){
      /* For an ORDER BY aggregate, calls to OP_AggStep were deferred.  Inputs
      ** were stored in emphermal table pF->iOBTab.  Here, we extract those
      ** inputs (in ORDER BY order) and make all calls to OP_AggStep
      ** before doing the OP_AggFinal call. */
      int iTop;        /* Start of loop for extracting columns */
      int nArg;        /* Number of columns to extract */
      int nKey;        /* Key columns to be skipped */
      int regAgg;      /* Extract into this array */
      int j;           /* Loop counter */

      assert( pF->pFunc!=0 );
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);

      if( pF->bOBPayload==0 ){
        nKey = 0;
      }else{
        assert( pF->pFExpr->pLeft!=0 );
        assert( ExprUseXList(pF->pFExpr->pLeft) );
        assert( pF->pFExpr->pLeft->x.pList!=0 );
        nKey = pF->pFExpr->pLeft->x.pList->nExpr;
        if( ALWAYS(!pF->bOBUnique) ) nKey++;
      }
      iTop = sqlite3VdbeAddOp1(v, OP_Rewind, pF->iOBTab); VdbeCoverage(v);
      for(j=nArg-1; j>=0; j--){
        sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, nKey+j, regAgg+j);
      }
      if( pF->bUseSubtype ){
        int regSubtype = sqlite3GetTempReg(pParse);
        int iBaseCol = nKey + nArg + (pF->bOBPayload==0 && pF->bOBUnique==0);
        for(j=nArg-1; j>=0; j--){
          sqlite3VdbeAddOp3(v, OP_Column, pF->iOBTab, iBaseCol+j, regSubtype);
          sqlite3VdbeAddOp2(v, OP_SetSubtype, regSubtype, regAgg+j);
        }
        sqlite3ReleaseTempReg(pParse, regSubtype);
      }
      sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, AggInfoFuncReg(pAggInfo,i));
      sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      sqlite3VdbeAddOp2(v, OP_Next, pF->iOBTab, iTop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, iTop);
      sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    }
    sqlite3VdbeAddOp2(v, OP_AggFinal, AggInfoFuncReg(pAggInfo,i),
                      pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}